

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_destroy_mutexes(void)

{
  int iVar1;
  Integer in_stack_00000198;
  char *in_stack_000001a0;
  undefined8 local_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (num_mutexes < 1) {
    pnga_error(in_stack_000001a0,in_stack_00000198);
  }
  num_mutexes = 0;
  if (GAnproc == 1) {
    local_8 = 1;
  }
  else {
    iVar1 = ARMCI_Destroy_mutexes();
    if (iVar1 == 0) {
      local_8 = 1;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

logical pnga_destroy_mutexes()
{
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(num_mutexes<1) pnga_error("mutexes destroyed",0);

   num_mutexes= 0;
   if(GAnproc == 1){
      return TRUE;
   }
   if(ARMCI_Destroy_mutexes()){
      return FALSE;
   }
   return TRUE;
}